

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_writer.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ObjectWriter::RenderDataPieceTo
          (ObjectWriter *this,DataPiece *data,StringPiece name,ObjectWriter *ow)

{
  int *piVar1;
  uint *puVar2;
  float *pfVar3;
  long *plVar4;
  bool *pbVar5;
  unsigned_long *puVar6;
  double *pdVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long *plVar9;
  char *pcVar10;
  StringPiece local_90;
  StringPiece local_80;
  undefined1 local_70 [72];
  
  plVar9 = (long *)name.length_;
  pcVar10 = name.ptr_;
  switch(*(undefined4 *)&this->use_strict_base64_decoding_) {
  case 1:
    DataPiece::ToInt32((StatusOr<int> *)local_70,(DataPiece *)this);
    piVar1 = StatusOr<int>::value((StatusOr<int> *)local_70);
    (**(code **)(*plVar9 + 0x38))(plVar9,data,pcVar10,*piVar1);
    break;
  case 2:
    DataPiece::ToInt64((StatusOr<long> *)local_70,(DataPiece *)this);
    plVar4 = StatusOr<long>::value((StatusOr<long> *)local_70);
    (**(code **)(*plVar9 + 0x48))(plVar9,data,pcVar10,*plVar4);
    break;
  case 3:
    DataPiece::ToUint32((StatusOr<unsigned_int> *)local_70,(DataPiece *)this);
    puVar2 = StatusOr<unsigned_int>::value((StatusOr<unsigned_int> *)local_70);
    (**(code **)(*plVar9 + 0x40))(plVar9,data,pcVar10,*puVar2);
    break;
  case 4:
    DataPiece::ToUint64((StatusOr<unsigned_long> *)local_70,(DataPiece *)this);
    puVar6 = StatusOr<unsigned_long>::value((StatusOr<unsigned_long> *)local_70);
    (**(code **)(*plVar9 + 0x50))(plVar9,data,pcVar10,*puVar6);
    break;
  case 5:
    DataPiece::ToDouble((StatusOr<double> *)local_70,(DataPiece *)this);
    pdVar7 = StatusOr<double>::value((StatusOr<double> *)local_70);
    (**(code **)(*plVar9 + 0x58))(*pdVar7,plVar9,data,pcVar10);
    break;
  case 6:
    DataPiece::ToFloat((StatusOr<float> *)local_70,(DataPiece *)this);
    pfVar3 = StatusOr<float>::value((StatusOr<float> *)local_70);
    (**(code **)(*plVar9 + 0x60))(*pfVar3,plVar9,data,pcVar10);
    break;
  case 7:
    DataPiece::ToBool((StatusOr<bool> *)local_70,(DataPiece *)this);
    pbVar5 = StatusOr<bool>::value((StatusOr<bool> *)local_70);
    (**(code **)(*plVar9 + 0x30))(plVar9,data,pcVar10,*pbVar5);
    break;
  default:
    goto switchD_0032fd73_caseD_8;
  case 9:
    DataPiece::ToString_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70,(DataPiece *)this);
    pbVar8 = StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_70);
    StringPiece::StringPiece<std::allocator<char>>(&local_90,pbVar8);
    (**(code **)(*plVar9 + 0x68))(plVar9,data,pcVar10,local_90.ptr_,local_90.length_);
    goto LAB_0032ff3c;
  case 10:
    DataPiece::ToBytes_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70,(DataPiece *)this);
    pbVar8 = StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::ValueOrDie((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_70);
    StringPiece::StringPiece<std::allocator<char>>(&local_80,pbVar8);
    (**(code **)(*plVar9 + 0x70))(plVar9,data,pcVar10,local_80.ptr_,local_80.length_);
LAB_0032ff3c:
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~StatusOr((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_70);
    return;
  case 0xb:
    (**(code **)(*plVar9 + 0x78))(plVar9,data,pcVar10);
    return;
  }
  std::__cxx11::string::~string((string *)(local_70 + 8));
switchD_0032fd73_caseD_8:
  return;
}

Assistant:

void ObjectWriter::RenderDataPieceTo(const DataPiece& data,
                                     StringPiece name, ObjectWriter* ow) {
  switch (data.type()) {
    case DataPiece::TYPE_INT32: {
      ow->RenderInt32(name, data.ToInt32().value());
      break;
    }
    case DataPiece::TYPE_INT64: {
      ow->RenderInt64(name, data.ToInt64().value());
      break;
    }
    case DataPiece::TYPE_UINT32: {
      ow->RenderUint32(name, data.ToUint32().value());
      break;
    }
    case DataPiece::TYPE_UINT64: {
      ow->RenderUint64(name, data.ToUint64().value());
      break;
    }
    case DataPiece::TYPE_DOUBLE: {
      ow->RenderDouble(name, data.ToDouble().value());
      break;
    }
    case DataPiece::TYPE_FLOAT: {
      ow->RenderFloat(name, data.ToFloat().value());
      break;
    }
    case DataPiece::TYPE_BOOL: {
      ow->RenderBool(name, data.ToBool().value());
      break;
    }
    case DataPiece::TYPE_STRING: {
      ow->RenderString(name, data.ToString().value());
      break;
    }
    case DataPiece::TYPE_BYTES: {
      ow->RenderBytes(name, data.ToBytes().ValueOrDie());
      break;
    }
    case DataPiece::TYPE_NULL: {
      ow->RenderNull(name);
      break;
    }
    default:
      break;
  }
}